

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O0

ssize_t __thiscall serial::Serial::read(Serial *this,int __fd,void *__buf,size_t __nbytes)

{
  exception *peVar1;
  undefined4 in_register_00000034;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  const_iterator local_58;
  exception *e;
  size_t bytes_read;
  uchar *local_30;
  uint8_t *buffer_;
  ScopedReadLock lock;
  size_t size_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  Serial *this_local;
  
  lock.pimpl_ = (SerialImpl *)__buf;
  ScopedReadLock::ScopedReadLock((ScopedReadLock *)&buffer_,this->pimpl_);
  local_30 = (uchar *)operator_new__((ulong)lock.pimpl_);
  e = (exception *)0x0;
  e = (exception *)SerialImpl::read(this->pimpl_,(int)local_30,lock.pimpl_,(size_t)local_30);
  local_60._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT44(in_register_00000034,__fd));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_58,&local_60);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             CONCAT44(in_register_00000034,__fd),local_58,local_30,local_30 + (long)e);
  if (local_30 != (uchar *)0x0) {
    operator_delete__(local_30);
  }
  peVar1 = e;
  ScopedReadLock::~ScopedReadLock((ScopedReadLock *)&buffer_);
  return (ssize_t)peVar1;
}

Assistant:

size_t
Serial::read (std::vector<uint8_t> &buffer, size_t size)
{
  ScopedReadLock lock(this->pimpl_);
  uint8_t *buffer_ = new uint8_t[size];
  size_t bytes_read = 0;

  try {
    bytes_read = this->pimpl_->read (buffer_, size);
  }
  catch (const std::exception &e) {
    delete[] buffer_;
    throw;
  }

  buffer.insert (buffer.end (), buffer_, buffer_+bytes_read);
  delete[] buffer_;
  return bytes_read;
}